

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::SetStencilRef(DeviceContextVkImpl *this,Uint32 StencilRef)

{
  uint32_t uVar1;
  bool bVar2;
  char (*in_RCX) [32];
  VkCommandBuffer pVVar3;
  string msg;
  string local_38;
  
  bVar2 = DeviceContextBase<Diligent::EngineVkImplTraits>::SetStencilRef
                    ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,StencilRef,0);
  if (bVar2) {
    EnsureVkCmdBuffer(this);
    uVar1 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_StencilRef;
    pVVar3 = (this->m_CommandBuffer).m_VkCmdBuffer;
    if (pVVar3 == (VkCommandBuffer)0x0) {
      FormatString<char[26],char[32]>
                (&local_38,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"SetStencilReference",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
                 ,0x1c3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      pVVar3 = (this->m_CommandBuffer).m_VkCmdBuffer;
    }
    (*vkCmdSetStencilReference)(pVVar3,3,uVar1);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::SetStencilRef(Uint32 StencilRef)
{
    if (TDeviceContextBase::SetStencilRef(StencilRef, 0))
    {
        EnsureVkCmdBuffer();
        m_CommandBuffer.SetStencilReference(m_StencilRef);
    }
}